

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.cpp
# Opt level: O1

int add_to_database_so(Map *symbol_file_map,string_view file_path)

{
  char *pcVar1;
  char cVar2;
  long *plVar3;
  long lVar4;
  istream *piVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  size_type *psVar8;
  int iVar9;
  char *__s;
  string_view command;
  string line;
  stringstream ss;
  string local_238;
  key_type local_218;
  ulong local_1f8;
  char *local_1f0;
  long local_1e8;
  Map *local_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  long local_1b8 [16];
  ios_base local_138 [264];
  
  local_1e0 = symbol_file_map;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"objdump -TCw ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_1d8);
  psVar8 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_218.field_2._M_allocated_capacity = *psVar8;
    local_218.field_2._8_8_ = plVar3[3];
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  }
  else {
    local_218.field_2._M_allocated_capacity = *psVar8;
    local_218._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_218._M_string_length = plVar3[1];
  *plVar3 = (long)psVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  command._M_str = local_218._M_dataplus._M_p;
  command._M_len = local_218._M_string_length;
  get_output_from_command_abi_cxx11_(&local_238,command);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)local_1b8,(string *)&local_238,_S_out|_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,
                    CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                             local_238.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  local_238._M_string_length = 0;
  local_238.field_2._M_local_buf[0] = '\0';
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  cVar2 = std::ios::widen((char)(stringstream *)local_1b8 +
                          (char)*(undefined8 *)(local_1b8[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_1b8,(string *)&local_238,cVar2);
  cVar2 = std::ios::widen((char)(istream *)local_1b8 + (char)*(undefined8 *)(local_1b8[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_1b8,(string *)&local_238,cVar2);
  cVar2 = std::ios::widen((char)(istream *)local_1b8 + (char)*(undefined8 *)(local_1b8[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_1b8,(string *)&local_238,cVar2);
  cVar2 = std::ios::widen((char)(istream *)local_1b8 + (char)*(undefined8 *)(local_1b8[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_1b8,(string *)&local_238,cVar2);
  cVar2 = std::ios::widen((char)(istream *)local_1b8 + (char)*(undefined8 *)(local_1b8[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_1b8,(string *)&local_238,cVar2);
  iVar9 = 0;
  lVar4 = std::__cxx11::string::find((char *)&local_238,0x1240de,0);
  if (lVar4 != -1) {
    local_1e8 = std::__cxx11::string::rfind((char *)&local_238,0x1240de,0xffffffffffffffff);
    if (local_1e8 != -1) {
      local_1f8 = 0;
      local_1f0 = file_path._M_str;
      while( true ) {
        cVar2 = std::ios::widen((char)*(undefined8 *)(local_1b8[0] + -0x18) +
                                (char)(istream *)local_1b8);
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_1b8,(string *)&local_238,cVar2);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        if (local_238._M_dataplus._M_p[lVar4 + 4] != '*' ||
            *(int *)(local_238._M_dataplus._M_p + lVar4) != 0x444e552a) {
          pcVar1 = local_238._M_dataplus._M_p + local_1e8 + -3;
          do {
            __s = pcVar1;
            pcVar1 = __s + 1;
          } while (*__s != ' ');
          do {
            pcVar1 = __s + 1;
            __s = __s + 1;
          } while (*pcVar1 == ' ');
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          sVar6 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,__s,__s + sVar6);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](local_1e0,&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::push_back((char)pmVar7);
          std::__cxx11::string::append((char *)pmVar7);
          local_1f8 = (ulong)((int)local_1f8 + 1);
        }
      }
      iVar9 = (int)local_1f8;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,
                    CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                             local_238.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return iVar9;
}

Assistant:

int add_to_database_so(Map &symbol_file_map, const string_view file_path) {
	int symbols = 0;
	std::stringstream ss(get_output_from_command(std::string("objdump -TCw ") + file_path.data()));
	std::string line;
	std::getline(ss, line); //empty line
	std::getline(ss, line); //file format
	std::getline(ss, line); //empty line
	std::getline(ss, line); //caption
	std::getline(ss, line); //.init line
	auto linit = line.find(".init");
	if (linit == std::string::npos) {
		return symbols;
	}
	auto rinit = line.rfind(".init");
	if (rinit == std::string::npos) {
		return symbols;
	}
	while (std::getline(ss, line)) {
		if (string_view(line.data() + linit, 5) == "*UND*") {
			continue;
		}
		auto symbol_pos = line.data() + rinit - 3;
		while (*symbol_pos++ != ' ') {
		}
		while (*symbol_pos == ' ') {
			symbol_pos++;
		}
		auto &entry = symbol_file_map[symbol_pos];
		entry.push_back(file_separator);
		entry += file_path.data();
		symbols++;
	}
	return symbols;
}